

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawElementsBaseVertexTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::DrawElementsBaseVertexTests::init
          (DrawElementsBaseVertexTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  undefined8 in_RAX;
  TestCaseGroup *this_00;
  DrawMethod method;
  undefined8 in_RDX;
  long lVar2;
  undefined1 auVar3 [16];
  string desc;
  string name;
  string local_70;
  string local_50;
  
  auVar3._8_8_ = in_RDX;
  auVar3._0_8_ = in_RAX;
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    uVar1 = *(uint *)((long)&DAT_018e0f2c + lVar2);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&local_50,(DrawTestSpec *)(ulong)uVar1,auVar3._8_4_);
    deqp::gls::DrawTestSpec::drawMethodToString_abi_cxx11_
              (&local_70,(DrawTestSpec *)(ulong)uVar1,method);
    this_00 = (TestCaseGroup *)operator_new(0x80);
    TestCaseGroup::TestCaseGroup
              (this_00,(this->super_TestCaseGroup).m_context,local_50._M_dataplus._M_p,
               local_70._M_dataplus._M_p);
    (this_00->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e61c00;
    *(uint *)&this_00[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_70);
    auVar3 = std::__cxx11::string::~string((string *)&local_50);
  }
  return auVar3._0_4_;
}

Assistant:

void DrawElementsBaseVertexTests::init (void)
{
	const gls::DrawTestSpec::DrawMethod basicMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_BASEVERTEX,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED_BASEVERTEX,
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(basicMethods); ++ndx)
	{
		const std::string name = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);
		const std::string desc = gls::DrawTestSpec::drawMethodToString(basicMethods[ndx]);

		this->addChild(new MethodGroup(m_context, name.c_str(), desc.c_str(), basicMethods[ndx]));
	}
}